

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

void llvm::sys::path::replace_extension(SmallVectorImpl<char> *path,Twine *extension,Style style)

{
  anon_unknown_dwarf_2b840c *this;
  long lVar1;
  char *in_start;
  size_t sVar2;
  Style style_00;
  ulong uVar3;
  ulong uVar5;
  StringRef str;
  StringRef SVar6;
  SmallString<32U> ext_storage;
  char local_65;
  Style local_64;
  SmallVectorImpl<char> local_60;
  undefined1 local_50 [32];
  ulong uVar4;
  
  this = (anon_unknown_dwarf_2b840c *)
         (path->super_SmallVectorTemplateBase<char,_true>).
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  uVar5 = (ulong)(path->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  local_60.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_50;
  style_00 = windows;
  local_60.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_60.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x20;
  local_64 = style;
  SVar6 = Twine::toStringRef(extension,&local_60);
  in_start = SVar6.Data;
  uVar4 = uVar5;
  do {
    uVar3 = uVar4 - 1;
    if (uVar4 == 0) goto LAB_00157ec3;
    lVar1 = uVar4 - 1;
    uVar4 = uVar3;
  } while (this[lVar1] != (anon_unknown_dwarf_2b840c)0x2e);
  str.Length._0_4_ = local_64;
  str.Data = (char *)uVar5;
  str.Length._4_4_ = 0;
  sVar2 = anon_unknown.dwarf_2b840c::filename_pos(this,str,style_00);
  if (sVar2 <= uVar3) {
    if ((path->super_SmallVectorTemplateBase<char,_true>).
        super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity < uVar3) {
      __assert_fail("Size <= capacity()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
    }
    (path->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.Size = (uint)uVar3;
  }
LAB_00157ec3:
  if ((SVar6.Length != 0) && (*in_start != '.')) {
    local_65 = '.';
    SmallVectorTemplateBase<char,_true>::push_back
              (&path->super_SmallVectorTemplateBase<char,_true>,&local_65);
  }
  SmallVectorImpl<char>::append<char_const*,void>(path,in_start,in_start + SVar6.Length);
  if ((undefined1 *)
      local_60.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
      .super_SmallVectorBase.BeginX != local_50) {
    free(local_60.super_SmallVectorTemplateBase<char,_true>.
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
  }
  return;
}

Assistant:

void replace_extension(SmallVectorImpl<char> &path, const Twine &extension,
                       Style style) {
  StringRef p(path.begin(), path.size());
  SmallString<32> ext_storage;
  StringRef ext = extension.toStringRef(ext_storage);

  // Erase existing extension.
  size_t pos = p.find_last_of('.');
  if (pos != StringRef::npos && pos >= filename_pos(p, style))
    path.set_size(pos);

  // Append '.' if needed.
  if (ext.size() > 0 && ext[0] != '.')
    path.push_back('.');

  // Append extension.
  path.append(ext.begin(), ext.end());
}